

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O0

void com_deblock_lcu_row(com_core_t *core,int lcu_y)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  int local_71c;
  int local_718;
  int local_714;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  int local_700;
  uint local_6fc;
  uint local_6f8;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  uint local_6d4;
  uint local_6d0;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  uint local_694;
  uint local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  uint local_66c;
  uint local_668;
  int local_664;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  uint local_62c;
  uint local_628;
  int local_624;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  int local_608;
  uint local_604;
  uint local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  uint local_5c4;
  uint local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  uint local_59c;
  uint local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  uint local_55c;
  uint local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  uint local_534;
  uint local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  uint local_4f4;
  uint local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  uint local_4cc;
  uint local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a4;
  int edge;
  int qp_q_3;
  int qp_q_2;
  int qp_p_1;
  s8 *map_qp;
  int pix_x_ver;
  int qp_q_1;
  int qp_q;
  int qp_p;
  s8 *map_top;
  s8 *map_cur;
  u8 *edge_flag;
  int qp;
  int qp_offset;
  pel *src_uv;
  pel *src_l;
  int pix_end_y;
  int pix_start_y;
  int fix_qp;
  int beta_ver_v;
  int alpha_ver_v;
  int beta_hor_v;
  int alpha_hor_v;
  int beta_ver_u;
  int alpha_ver_u;
  int beta_hor_u;
  int alpha_hor_u;
  int beta_ver_y;
  int alpha_ver_y;
  int beta_hor_y;
  int alpha_hor_y;
  int shift;
  int s_c;
  int s_l;
  int i_scu;
  int i_lcu;
  int pix_x;
  int pix_y;
  com_pic_t *pic;
  com_map_t *map;
  com_pic_header_t *pichdr;
  com_seqh_t *seqhdr;
  com_core_t *pcStack_3d0;
  int lcu_y_local;
  com_core_t *core_local;
  int *piStack_3c0;
  int qp_16;
  int *local_3b8;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  com_map_t *local_3a0;
  int local_394;
  int *piStack_390;
  int qp_13;
  int *local_388;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  com_map_t *local_370;
  int local_364;
  int *piStack_360;
  int qp_10;
  int *local_358;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  com_map_t *local_340;
  int local_334;
  int *piStack_330;
  int qp_7;
  int *local_328;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  com_map_t *local_310;
  int local_304;
  int *piStack_300;
  int qp_4;
  int *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  com_pic_header_t *local_2e0;
  int local_2d4;
  int *piStack_2d0;
  int qp_1;
  int *local_2c8;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  com_pic_header_t *local_2b0;
  uint local_2a8;
  uint local_2a4;
  int qp_uv_q_11;
  int qp_uv_p_11;
  int qp_18;
  int *local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  com_map_t *local_278;
  uint local_270;
  uint local_26c;
  int qp_uv_q_10;
  int qp_uv_p_10;
  int qp_17;
  int *local_258;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  com_map_t *local_240;
  uint local_238;
  uint local_234;
  int qp_uv_q_9;
  int qp_uv_p_9;
  int qp_15;
  int *local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  com_map_t *local_208;
  uint local_200;
  uint local_1fc;
  int qp_uv_q_8;
  int qp_uv_p_8;
  int qp_14;
  int *local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  com_map_t *local_1d0;
  uint local_1c8;
  uint local_1c4;
  int qp_uv_q_7;
  int qp_uv_p_7;
  int qp_12;
  int *local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  com_map_t *local_198;
  uint local_190;
  uint local_18c;
  int qp_uv_q_6;
  int qp_uv_p_6;
  int qp_11;
  int *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  com_map_t *local_160;
  uint local_158;
  uint local_154;
  int qp_uv_q_5;
  int qp_uv_p_5;
  int qp_9;
  int *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  com_map_t *local_128;
  uint local_120;
  uint local_11c;
  int qp_uv_q_4;
  int qp_uv_p_4;
  int qp_8;
  int *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  com_map_t *local_f0;
  uint local_e8;
  uint local_e4;
  int qp_uv_q_3;
  int qp_uv_p_3;
  int qp_6;
  int *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  com_pic_header_t *local_b8;
  uint local_b0;
  uint local_ac;
  int qp_uv_q_2;
  int qp_uv_p_2;
  int qp_5;
  int *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  com_pic_header_t *local_80;
  uint local_78;
  uint local_74;
  int qp_uv_q_1;
  int qp_uv_p_1;
  int qp_3;
  int *local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  com_pic_header_t *local_48;
  uint local_40;
  uint local_3c;
  int qp_uv_q;
  int qp_uv_p;
  int qp_2;
  int *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  com_pic_header_t *local_10;
  
  pichdr = (com_pic_header_t *)core->seqhdr;
  map = (com_map_t *)core->pichdr;
  pic = (com_pic_t *)&core->map;
  _pix_x = core->pic;
  s_l = ((com_seqh_t *)pichdr)->pic_width_in_lcu;
  s_c = ((com_seqh_t *)pichdr)->i_scu;
  shift = _pix_x->stride_luma;
  alpha_hor_y = _pix_x->stride_chroma;
  beta_hor_y = ((com_seqh_t *)pichdr)->bit_depth_internal + -8;
  iVar3 = ((com_pic_header_t *)map)->fixed_picture_qp_flag;
  i_lcu = lcu_y * ((com_seqh_t *)pichdr)->max_cuwh;
  if (i_lcu + ((com_seqh_t *)pichdr)->max_cuwh < ((com_seqh_t *)pichdr)->pic_height) {
    local_4ac = i_lcu + ((com_seqh_t *)pichdr)->max_cuwh;
  }
  else {
    local_4ac = ((com_seqh_t *)pichdr)->pic_height;
  }
  src_uv = _pix_x->y + i_lcu * shift;
  _qp = _pix_x->uv + (i_lcu >> 1) * alpha_hor_y;
  iVar4 = ((com_seqh_t *)pichdr)->bit_depth_2_qp_offset;
  seqhdr._4_4_ = lcu_y;
  pcStack_3d0 = core;
  if (iVar3 != 0) {
    local_2e8 = (int)(core->map).map_qp[lcu_y * s_l];
    local_2c8 = &alpha_ver_y;
    piStack_2d0 = &beta_ver_y;
    local_2d4 = local_2e8 * 2 + 1 + iVar4 * -2 >> 1;
    if (local_2d4 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_4b0 = local_2d4 + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_4b0 = 0x3f;
    }
    if (local_4b0 < 0) {
      local_4b4 = 0;
    }
    else {
      if (local_2d4 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_4b8 = local_2d4 + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_4b8 = 0x3f;
      }
      local_4b4 = local_4b8;
    }
    bVar11 = (byte)beta_hor_y;
    alpha_ver_y = (uint)""[local_4b4] << (bVar11 & 0x1f);
    if (local_2d4 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_4bc = local_2d4 + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_4bc = 0x3f;
    }
    if (local_4bc < 0) {
      local_4c0 = 0;
    }
    else {
      if (local_2d4 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_4c4 = local_2d4 + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_4c4 = 0x3f;
      }
      local_4c0 = local_4c4;
    }
    beta_ver_y = (uint)""[local_4c0] << (bVar11 & 0x1f);
    qp_uv_p = (int)((com_pic_header_t *)map)->chroma_quant_param_delta_cb;
    local_28 = &alpha_ver_u;
    _qp_2 = &beta_ver_u;
    local_4c8 = (local_2e8 + qp_uv_p) - iVar4;
    local_4cc = (local_2e8 + qp_uv_p) - iVar4;
    local_3c = local_4c8;
    if (-1 < (int)local_4c8) {
      if (0x3f < (int)local_4c8) {
        local_4c8 = 0x3f;
      }
      local_3c = (uint)""[(int)local_4c8];
    }
    local_40 = local_4cc;
    if (-1 < (int)local_4cc) {
      if (0x3f < (int)local_4cc) {
        local_4cc = 0x3f;
      }
      local_40 = (uint)""[(int)local_4cc];
    }
    if ((int)(local_3c + iVar4) < 0) {
      local_4d0 = 0;
    }
    else {
      local_4d0 = local_3c + iVar4;
    }
    local_3c = local_4d0;
    if ((int)(local_40 + iVar4) < 0) {
      local_4d4 = 0;
    }
    else {
      local_4d4 = local_40 + iVar4;
    }
    local_40 = local_4d4;
    qp_uv_q = (local_4d0 + local_4d4 + 1 >> 1) - iVar4;
    if (qp_uv_q + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_4d8 = qp_uv_q + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_4d8 = 0x3f;
    }
    if (local_4d8 < 0) {
      local_4dc = 0;
    }
    else {
      if (qp_uv_q + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_4e0 = qp_uv_q + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_4e0 = 0x3f;
      }
      local_4dc = local_4e0;
    }
    alpha_ver_u = (uint)""[local_4dc] << (bVar11 & 0x1f);
    if (qp_uv_q + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_4e4 = qp_uv_q + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_4e4 = 0x3f;
    }
    if (local_4e4 < 0) {
      local_4e8 = 0;
    }
    else {
      if (qp_uv_q + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_4ec = qp_uv_q + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_4ec = 0x3f;
      }
      local_4e8 = local_4ec;
    }
    beta_ver_u = (uint)""[local_4e8] << (bVar11 & 0x1f);
    qp_uv_p_1 = (int)((com_pic_header_t *)map)->chroma_quant_param_delta_cr;
    local_60 = &alpha_ver_v;
    _qp_3 = &beta_ver_v;
    local_4f0 = (local_2e8 + qp_uv_p_1) - iVar4;
    local_4f4 = (local_2e8 + qp_uv_p_1) - iVar4;
    local_74 = local_4f0;
    if (-1 < (int)local_4f0) {
      if (0x3f < (int)local_4f0) {
        local_4f0 = 0x3f;
      }
      local_74 = (uint)""[(int)local_4f0];
    }
    local_78 = local_4f4;
    if (-1 < (int)local_4f4) {
      if (0x3f < (int)local_4f4) {
        local_4f4 = 0x3f;
      }
      local_78 = (uint)""[(int)local_4f4];
    }
    if ((int)(local_74 + iVar4) < 0) {
      local_4f8 = 0;
    }
    else {
      local_4f8 = local_74 + iVar4;
    }
    local_74 = local_4f8;
    if ((int)(local_78 + iVar4) < 0) {
      local_4fc = 0;
    }
    else {
      local_4fc = local_78 + iVar4;
    }
    local_78 = local_4fc;
    qp_uv_q_1 = (local_4f8 + local_4fc + 1 >> 1) - iVar4;
    if (qp_uv_q_1 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_500 = qp_uv_q_1 + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_500 = 0x3f;
    }
    if (local_500 < 0) {
      local_504 = 0;
    }
    else {
      if (qp_uv_q_1 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_508 = qp_uv_q_1 + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_508 = 0x3f;
      }
      local_504 = local_508;
    }
    alpha_ver_v = (uint)""[local_504] << (bVar11 & 0x1f);
    if (qp_uv_q_1 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_50c = qp_uv_q_1 + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_50c = 0x3f;
    }
    if (local_50c < 0) {
      local_510 = 0;
    }
    else {
      if (qp_uv_q_1 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_514 = qp_uv_q_1 + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_514 = 0x3f;
      }
      local_510 = local_514;
    }
    beta_ver_v = (uint)""[local_510] << (bVar11 & 0x1f);
    local_2f8 = &alpha_hor_u;
    piStack_300 = &beta_hor_u;
    local_304 = local_2e8 * 2 + 1 + iVar4 * -2 >> 1;
    if (local_304 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_518 = local_304 + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_518 = 0x3f;
    }
    if (local_518 < 0) {
      local_51c = 0;
    }
    else {
      if (local_304 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_520 = local_304 + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_520 = 0x3f;
      }
      local_51c = local_520;
    }
    alpha_hor_u = (uint)""[local_51c] << (bVar11 & 0x1f);
    if (local_304 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_524 = local_304 + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_524 = 0x3f;
    }
    if (local_524 < 0) {
      local_528 = 0;
    }
    else {
      if (local_304 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_52c = local_304 + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_52c = 0x3f;
      }
      local_528 = local_52c;
    }
    beta_hor_u = (uint)""[local_528] << (bVar11 & 0x1f);
    qp_uv_p_2 = (int)((com_pic_header_t *)map)->chroma_quant_param_delta_cb;
    local_98 = &alpha_hor_v;
    _qp_5 = &beta_hor_v;
    local_530 = (local_2e8 + qp_uv_p_2) - iVar4;
    local_534 = (local_2e8 + qp_uv_p_2) - iVar4;
    local_ac = local_530;
    if (-1 < (int)local_530) {
      if (0x3f < (int)local_530) {
        local_530 = 0x3f;
      }
      local_ac = (uint)""[(int)local_530];
    }
    local_b0 = local_534;
    if (-1 < (int)local_534) {
      if (0x3f < (int)local_534) {
        local_534 = 0x3f;
      }
      local_b0 = (uint)""[(int)local_534];
    }
    if ((int)(local_ac + iVar4) < 0) {
      local_538 = 0;
    }
    else {
      local_538 = local_ac + iVar4;
    }
    local_ac = local_538;
    if ((int)(local_b0 + iVar4) < 0) {
      local_53c = 0;
    }
    else {
      local_53c = local_b0 + iVar4;
    }
    local_b0 = local_53c;
    qp_uv_q_2 = (local_538 + local_53c + 1 >> 1) - iVar4;
    if (qp_uv_q_2 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_540 = qp_uv_q_2 + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_540 = 0x3f;
    }
    if (local_540 < 0) {
      local_544 = 0;
    }
    else {
      if (qp_uv_q_2 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_548 = qp_uv_q_2 + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_548 = 0x3f;
      }
      local_544 = local_548;
    }
    alpha_hor_v = (uint)""[local_544] << (bVar11 & 0x1f);
    if (qp_uv_q_2 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_54c = qp_uv_q_2 + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_54c = 0x3f;
    }
    if (local_54c < 0) {
      local_550 = 0;
    }
    else {
      if (qp_uv_q_2 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_554 = qp_uv_q_2 + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_554 = 0x3f;
      }
      local_550 = local_554;
    }
    beta_hor_v = (uint)""[local_550] << (bVar11 & 0x1f);
    qp_uv_p_3 = (int)((com_pic_header_t *)map)->chroma_quant_param_delta_cr;
    local_d0 = &fix_qp;
    _qp_6 = &pix_start_y;
    local_558 = (local_2e8 + qp_uv_p_3) - iVar4;
    local_55c = (local_2e8 + qp_uv_p_3) - iVar4;
    local_e4 = local_558;
    if (-1 < (int)local_558) {
      if (0x3f < (int)local_558) {
        local_558 = 0x3f;
      }
      local_e4 = (uint)""[(int)local_558];
    }
    local_e8 = local_55c;
    if (-1 < (int)local_55c) {
      if (0x3f < (int)local_55c) {
        local_55c = 0x3f;
      }
      local_e8 = (uint)""[(int)local_55c];
    }
    if ((int)(local_e4 + iVar4) < 0) {
      local_560 = 0;
    }
    else {
      local_560 = local_e4 + iVar4;
    }
    local_e4 = local_560;
    if ((int)(local_e8 + iVar4) < 0) {
      local_564 = 0;
    }
    else {
      local_564 = local_e8 + iVar4;
    }
    local_e8 = local_564;
    qp_uv_q_3 = (local_560 + local_564 + 1 >> 1) - iVar4;
    if (qp_uv_q_3 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
      local_568 = qp_uv_q_3 + ((com_pic_header_t *)map)->alpha_c_offset;
    }
    else {
      local_568 = 0x3f;
    }
    if (local_568 < 0) {
      local_56c = 0;
    }
    else {
      if (qp_uv_q_3 + ((com_pic_header_t *)map)->alpha_c_offset < 0x40) {
        local_570 = qp_uv_q_3 + ((com_pic_header_t *)map)->alpha_c_offset;
      }
      else {
        local_570 = 0x3f;
      }
      local_56c = local_570;
    }
    fix_qp = (uint)""[local_56c] << (bVar11 & 0x1f);
    if (qp_uv_q_3 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
      local_574 = qp_uv_q_3 + ((com_pic_header_t *)map)->beta_offset;
    }
    else {
      local_574 = 0x3f;
    }
    if (local_574 < 0) {
      local_578 = 0;
    }
    else {
      if (qp_uv_q_3 + ((com_pic_header_t *)map)->beta_offset < 0x40) {
        local_57c = qp_uv_q_3 + ((com_pic_header_t *)map)->beta_offset;
      }
      else {
        local_57c = 0x3f;
      }
      local_578 = local_57c;
    }
    pix_start_y = (uint)""[local_578] << (bVar11 & 0x1f);
    local_2f0 = beta_hor_y;
    local_2ec = iVar4;
    local_2e4 = local_2e8;
    local_2e0 = (com_pic_header_t *)map;
    local_2c0 = beta_hor_y;
    local_2bc = iVar4;
    local_2b8 = local_2e8;
    local_2b4 = local_2e8;
    local_2b0 = (com_pic_header_t *)map;
    local_c8 = beta_hor_y;
    local_c4 = iVar4;
    local_c0 = local_2e8;
    local_bc = local_2e8;
    local_b8 = (com_pic_header_t *)map;
    local_90 = beta_hor_y;
    local_8c = iVar4;
    local_88 = local_2e8;
    local_84 = local_2e8;
    local_80 = (com_pic_header_t *)map;
    local_58 = beta_hor_y;
    local_54 = iVar4;
    local_50 = local_2e8;
    local_4c = local_2e8;
    local_48 = (com_pic_header_t *)map;
    local_20 = beta_hor_y;
    local_1c = iVar4;
    local_18 = local_2e8;
    local_14 = local_2e8;
    local_10 = (com_pic_header_t *)map;
  }
  for (; i_lcu < local_4ac; i_lcu = i_lcu + 8) {
    map_cur = (s8 *)(*(long *)&pic->stride_luma + (long)((i_lcu >> 2) * s_c));
    pcVar8 = (char *)(*(long *)&pic->padsize_luma +
                     (long)((i_lcu >> ((byte)pichdr[4].alf_param.filterCoeff_luma[7][8] & 0x1f)) *
                           s_l));
    pcVar9 = (char *)(*(long *)&pic->padsize_luma +
                     (long)((i_lcu + -8 >> ((byte)pichdr[4].alf_param.filterCoeff_luma[7][8] & 0x1f)
                            ) * s_l));
    if (iVar3 == 0) {
      local_348 = (int)*pcVar8;
      bVar11 = (byte)beta_hor_y;
      if (i_lcu != 0) {
        local_318 = (int)*pcVar9;
        local_310 = map;
        local_320 = beta_hor_y;
        local_328 = &alpha_ver_y;
        piStack_330 = &beta_ver_y;
        local_334 = local_348 + local_318 + 1 + iVar4 * -2 >> 1;
        if (local_334 + *(int *)&map[2].map_ipm < 0x40) {
          local_580 = local_334 + *(int *)&map[2].map_ipm;
        }
        else {
          local_580 = 0x3f;
        }
        if (local_580 < 0) {
          local_584 = 0;
        }
        else {
          if (local_334 + *(int *)&map[2].map_ipm < 0x40) {
            local_588 = local_334 + *(int *)&map[2].map_ipm;
          }
          else {
            local_588 = 0x3f;
          }
          local_584 = local_588;
        }
        alpha_ver_y = (uint)""[local_584] << (bVar11 & 0x1f);
        if (local_334 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_58c = local_334 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_58c = 0x3f;
        }
        if (local_58c < 0) {
          local_590 = 0;
        }
        else {
          if (local_334 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_594 = local_334 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_594 = 0x3f;
          }
          local_590 = local_594;
        }
        beta_ver_y = (uint)""[local_590] << (bVar11 & 0x1f);
        qp_uv_p_4 = (int)*(char *)((long)&map[2].map_patch + 1);
        local_f0 = map;
        local_100 = beta_hor_y;
        local_108 = &alpha_ver_u;
        _qp_8 = &beta_ver_u;
        local_598 = (local_348 + qp_uv_p_4) - iVar4;
        local_59c = (local_318 + qp_uv_p_4) - iVar4;
        local_11c = local_598;
        if (-1 < (int)local_598) {
          if (0x3f < (int)local_598) {
            local_598 = 0x3f;
          }
          local_11c = (uint)""[(int)local_598];
        }
        local_120 = local_59c;
        if (-1 < (int)local_59c) {
          if (0x3f < (int)local_59c) {
            local_59c = 0x3f;
          }
          local_120 = (uint)""[(int)local_59c];
        }
        if ((int)(local_11c + iVar4) < 0) {
          local_5a0 = 0;
        }
        else {
          local_5a0 = local_11c + iVar4;
        }
        local_11c = local_5a0;
        if ((int)(local_120 + iVar4) < 0) {
          local_5a4 = 0;
        }
        else {
          local_5a4 = local_120 + iVar4;
        }
        local_120 = local_5a4;
        qp_uv_q_4 = (local_5a0 + local_5a4 + 1 >> 1) - iVar4;
        if (qp_uv_q_4 + *(int *)&map[2].map_ipm < 0x40) {
          local_5a8 = qp_uv_q_4 + *(int *)&map[2].map_ipm;
        }
        else {
          local_5a8 = 0x3f;
        }
        if (local_5a8 < 0) {
          local_5ac = 0;
        }
        else {
          if (qp_uv_q_4 + *(int *)&map[2].map_ipm < 0x40) {
            local_5b0 = qp_uv_q_4 + *(int *)&map[2].map_ipm;
          }
          else {
            local_5b0 = 0x3f;
          }
          local_5ac = local_5b0;
        }
        alpha_ver_u = (uint)""[local_5ac] << (bVar11 & 0x1f);
        if (qp_uv_q_4 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_5b4 = qp_uv_q_4 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_5b4 = 0x3f;
        }
        if (local_5b4 < 0) {
          local_5b8 = 0;
        }
        else {
          if (qp_uv_q_4 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_5bc = qp_uv_q_4 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_5bc = 0x3f;
          }
          local_5b8 = local_5bc;
        }
        beta_ver_u = (uint)""[local_5b8] << (bVar11 & 0x1f);
        qp_uv_p_5 = (int)*(char *)((long)&map[2].map_patch + 2);
        local_128 = map;
        local_138 = beta_hor_y;
        local_140 = &alpha_ver_v;
        _qp_9 = &beta_ver_v;
        local_5c0 = (local_348 + qp_uv_p_5) - iVar4;
        local_5c4 = (local_318 + qp_uv_p_5) - iVar4;
        local_154 = local_5c0;
        if (-1 < (int)local_5c0) {
          if (0x3f < (int)local_5c0) {
            local_5c0 = 0x3f;
          }
          local_154 = (uint)""[(int)local_5c0];
        }
        local_158 = local_5c4;
        if (-1 < (int)local_5c4) {
          if (0x3f < (int)local_5c4) {
            local_5c4 = 0x3f;
          }
          local_158 = (uint)""[(int)local_5c4];
        }
        if ((int)(local_154 + iVar4) < 0) {
          local_5c8 = 0;
        }
        else {
          local_5c8 = local_154 + iVar4;
        }
        local_154 = local_5c8;
        if ((int)(local_158 + iVar4) < 0) {
          local_5cc = 0;
        }
        else {
          local_5cc = local_158 + iVar4;
        }
        local_158 = local_5cc;
        qp_uv_q_5 = (local_5c8 + local_5cc + 1 >> 1) - iVar4;
        if (qp_uv_q_5 + *(int *)&map[2].map_ipm < 0x40) {
          local_5d0 = qp_uv_q_5 + *(int *)&map[2].map_ipm;
        }
        else {
          local_5d0 = 0x3f;
        }
        if (local_5d0 < 0) {
          local_5d4 = 0;
        }
        else {
          if (qp_uv_q_5 + *(int *)&map[2].map_ipm < 0x40) {
            local_5d8 = qp_uv_q_5 + *(int *)&map[2].map_ipm;
          }
          else {
            local_5d8 = 0x3f;
          }
          local_5d4 = local_5d8;
        }
        alpha_ver_v = (uint)""[local_5d4] << (bVar11 & 0x1f);
        if (qp_uv_q_5 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_5dc = qp_uv_q_5 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_5dc = 0x3f;
        }
        if (local_5dc < 0) {
          local_5e0 = 0;
        }
        else {
          if (qp_uv_q_5 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_5e4 = qp_uv_q_5 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_5e4 = 0x3f;
          }
          local_5e0 = local_5e4;
        }
        beta_ver_v = (uint)""[local_5e0] << (bVar11 & 0x1f);
        local_31c = iVar4;
        local_314 = local_348;
        local_134 = iVar4;
        local_130 = local_318;
        local_12c = local_348;
        local_fc = iVar4;
        local_f8 = local_318;
        local_f4 = local_348;
      }
      local_340 = map;
      local_350 = beta_hor_y;
      local_358 = &alpha_hor_u;
      piStack_360 = &beta_hor_u;
      local_364 = local_348 * 2 + 1 + iVar4 * -2 >> 1;
      if (local_364 + *(int *)&map[2].map_ipm < 0x40) {
        local_5e8 = local_364 + *(int *)&map[2].map_ipm;
      }
      else {
        local_5e8 = 0x3f;
      }
      if (local_5e8 < 0) {
        local_5ec = 0;
      }
      else {
        if (local_364 + *(int *)&map[2].map_ipm < 0x40) {
          local_5f0 = local_364 + *(int *)&map[2].map_ipm;
        }
        else {
          local_5f0 = 0x3f;
        }
        local_5ec = local_5f0;
      }
      alpha_hor_u = (uint)""[local_5ec] << (bVar11 & 0x1f);
      if (local_364 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
        local_5f4 = local_364 + *(int *)((long)&map[2].map_ipm + 4);
      }
      else {
        local_5f4 = 0x3f;
      }
      if (local_5f4 < 0) {
        local_5f8 = 0;
      }
      else {
        if (local_364 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_5fc = local_364 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_5fc = 0x3f;
        }
        local_5f8 = local_5fc;
      }
      beta_hor_u = (uint)""[local_5f8] << (bVar11 & 0x1f);
      qp_uv_p_6 = (int)*(char *)((long)&map[2].map_patch + 1);
      local_160 = map;
      local_170 = beta_hor_y;
      local_178 = &alpha_hor_v;
      _qp_11 = &beta_hor_v;
      local_600 = (local_348 + qp_uv_p_6) - iVar4;
      local_604 = (local_348 + qp_uv_p_6) - iVar4;
      local_18c = local_600;
      if (-1 < (int)local_600) {
        if (0x3f < (int)local_600) {
          local_600 = 0x3f;
        }
        local_18c = (uint)""[(int)local_600];
      }
      local_190 = local_604;
      if (-1 < (int)local_604) {
        if (0x3f < (int)local_604) {
          local_604 = 0x3f;
        }
        local_190 = (uint)""[(int)local_604];
      }
      if ((int)(local_18c + iVar4) < 0) {
        local_608 = 0;
      }
      else {
        local_608 = local_18c + iVar4;
      }
      local_18c = local_608;
      if ((int)(local_190 + iVar4) < 0) {
        local_60c = 0;
      }
      else {
        local_60c = local_190 + iVar4;
      }
      local_190 = local_60c;
      qp_uv_q_6 = (local_608 + local_60c + 1 >> 1) - iVar4;
      if (qp_uv_q_6 + *(int *)&map[2].map_ipm < 0x40) {
        local_610 = qp_uv_q_6 + *(int *)&map[2].map_ipm;
      }
      else {
        local_610 = 0x3f;
      }
      if (local_610 < 0) {
        local_614 = 0;
      }
      else {
        if (qp_uv_q_6 + *(int *)&map[2].map_ipm < 0x40) {
          local_618 = qp_uv_q_6 + *(int *)&map[2].map_ipm;
        }
        else {
          local_618 = 0x3f;
        }
        local_614 = local_618;
      }
      alpha_hor_v = (uint)""[local_614] << (bVar11 & 0x1f);
      if (qp_uv_q_6 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
        local_61c = qp_uv_q_6 + *(int *)((long)&map[2].map_ipm + 4);
      }
      else {
        local_61c = 0x3f;
      }
      if (local_61c < 0) {
        local_620 = 0;
      }
      else {
        if (qp_uv_q_6 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_624 = qp_uv_q_6 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_624 = 0x3f;
        }
        local_620 = local_624;
      }
      beta_hor_v = (uint)""[local_620] << (bVar11 & 0x1f);
      qp_uv_p_7 = (int)*(char *)((long)&map[2].map_patch + 2);
      local_198 = map;
      local_1a8 = beta_hor_y;
      local_1b0 = &fix_qp;
      _qp_12 = &pix_start_y;
      local_628 = (local_348 + qp_uv_p_7) - iVar4;
      local_62c = (local_348 + qp_uv_p_7) - iVar4;
      local_1c4 = local_628;
      if (-1 < (int)local_628) {
        if (0x3f < (int)local_628) {
          local_628 = 0x3f;
        }
        local_1c4 = (uint)""[(int)local_628];
      }
      local_1c8 = local_62c;
      if (-1 < (int)local_62c) {
        if (0x3f < (int)local_62c) {
          local_62c = 0x3f;
        }
        local_1c8 = (uint)""[(int)local_62c];
      }
      if ((int)(local_1c4 + iVar4) < 0) {
        local_630 = 0;
      }
      else {
        local_630 = local_1c4 + iVar4;
      }
      local_1c4 = local_630;
      if ((int)(local_1c8 + iVar4) < 0) {
        local_634 = 0;
      }
      else {
        local_634 = local_1c8 + iVar4;
      }
      local_1c8 = local_634;
      qp_uv_q_7 = (local_630 + local_634 + 1 >> 1) - iVar4;
      if (qp_uv_q_7 + *(int *)&map[2].map_ipm < 0x40) {
        local_638 = qp_uv_q_7 + *(int *)&map[2].map_ipm;
      }
      else {
        local_638 = 0x3f;
      }
      if (local_638 < 0) {
        local_63c = 0;
      }
      else {
        if (qp_uv_q_7 + *(int *)&map[2].map_ipm < 0x40) {
          local_640 = qp_uv_q_7 + *(int *)&map[2].map_ipm;
        }
        else {
          local_640 = 0x3f;
        }
        local_63c = local_640;
      }
      fix_qp = (uint)""[local_63c] << (bVar11 & 0x1f);
      if (qp_uv_q_7 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
        local_644 = qp_uv_q_7 + *(int *)((long)&map[2].map_ipm + 4);
      }
      else {
        local_644 = 0x3f;
      }
      if (local_644 < 0) {
        local_648 = 0;
      }
      else {
        if (qp_uv_q_7 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
          local_64c = qp_uv_q_7 + *(int *)((long)&map[2].map_ipm + 4);
        }
        else {
          local_64c = 0x3f;
        }
        local_648 = local_64c;
      }
      pix_start_y = (uint)""[local_648] << (bVar11 & 0x1f);
      local_34c = iVar4;
      local_344 = local_348;
      local_1a4 = iVar4;
      local_1a0 = local_348;
      local_19c = local_348;
      local_16c = iVar4;
      local_168 = local_348;
      local_164 = local_348;
    }
    for (i_scu = 0; i_scu < pichdr[4].alf_param.filterCoeff_luma[7][5]; i_scu = i_scu + 8) {
      iVar5 = i_scu + 8;
      if (iVar3 == 0) {
        pcVar10 = pcVar8 + (i_scu >> ((byte)pichdr[4].alf_param.filterCoeff_luma[7][8] & 0x1f));
        iVar6 = (int)*pcVar10;
        bVar11 = (byte)beta_hor_y;
        if (((i_scu % pichdr[4].alf_param.filterCoeff_luma[7][7] == 0) && (i_scu != 0)) &&
           (i_lcu != 0)) {
          local_378 = (int)pcVar9[i_scu >> ((byte)pichdr[4].alf_param.filterCoeff_luma[7][8] & 0x1f)
                                 ];
          local_370 = map;
          local_380 = beta_hor_y;
          local_388 = &alpha_ver_y;
          piStack_390 = &beta_ver_y;
          local_394 = iVar6 + local_378 + 1 + iVar4 * -2 >> 1;
          if (local_394 + *(int *)&map[2].map_ipm < 0x40) {
            local_650 = local_394 + *(int *)&map[2].map_ipm;
          }
          else {
            local_650 = 0x3f;
          }
          if (local_650 < 0) {
            local_654 = 0;
          }
          else {
            if (local_394 + *(int *)&map[2].map_ipm < 0x40) {
              local_658 = local_394 + *(int *)&map[2].map_ipm;
            }
            else {
              local_658 = 0x3f;
            }
            local_654 = local_658;
          }
          alpha_ver_y = (uint)""[local_654] << (bVar11 & 0x1f);
          if (local_394 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_65c = local_394 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_65c = 0x3f;
          }
          if (local_65c < 0) {
            local_660 = 0;
          }
          else {
            if (local_394 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_664 = local_394 + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_664 = 0x3f;
            }
            local_660 = local_664;
          }
          beta_ver_y = (uint)""[local_660] << (bVar11 & 0x1f);
          qp_uv_p_8 = (int)*(char *)((long)&map[2].map_patch + 1);
          local_1d0 = map;
          local_1e0 = beta_hor_y;
          local_1e8 = &alpha_ver_u;
          _qp_14 = &beta_ver_u;
          local_668 = (iVar6 + qp_uv_p_8) - iVar4;
          local_66c = (local_378 + qp_uv_p_8) - iVar4;
          local_1fc = local_668;
          if (-1 < (int)local_668) {
            if (0x3f < (int)local_668) {
              local_668 = 0x3f;
            }
            local_1fc = (uint)""[(int)local_668];
          }
          local_200 = local_66c;
          if (-1 < (int)local_66c) {
            if (0x3f < (int)local_66c) {
              local_66c = 0x3f;
            }
            local_200 = (uint)""[(int)local_66c];
          }
          if ((int)(local_1fc + iVar4) < 0) {
            local_670 = 0;
          }
          else {
            local_670 = local_1fc + iVar4;
          }
          local_1fc = local_670;
          if ((int)(local_200 + iVar4) < 0) {
            local_674 = 0;
          }
          else {
            local_674 = local_200 + iVar4;
          }
          local_200 = local_674;
          qp_uv_q_8 = (local_670 + local_674 + 1 >> 1) - iVar4;
          if (qp_uv_q_8 + *(int *)&map[2].map_ipm < 0x40) {
            local_678 = qp_uv_q_8 + *(int *)&map[2].map_ipm;
          }
          else {
            local_678 = 0x3f;
          }
          if (local_678 < 0) {
            local_67c = 0;
          }
          else {
            if (qp_uv_q_8 + *(int *)&map[2].map_ipm < 0x40) {
              local_680 = qp_uv_q_8 + *(int *)&map[2].map_ipm;
            }
            else {
              local_680 = 0x3f;
            }
            local_67c = local_680;
          }
          alpha_ver_u = (uint)""[local_67c] << (bVar11 & 0x1f);
          if (qp_uv_q_8 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_684 = qp_uv_q_8 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_684 = 0x3f;
          }
          if (local_684 < 0) {
            local_688 = 0;
          }
          else {
            if (qp_uv_q_8 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_68c = qp_uv_q_8 + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_68c = 0x3f;
            }
            local_688 = local_68c;
          }
          beta_ver_u = (uint)""[local_688] << (bVar11 & 0x1f);
          qp_uv_p_9 = (int)*(char *)((long)&map[2].map_patch + 2);
          local_208 = map;
          local_218 = beta_hor_y;
          local_220 = &alpha_ver_v;
          _qp_15 = &beta_ver_v;
          local_690 = (iVar6 + qp_uv_p_9) - iVar4;
          local_694 = (local_378 + qp_uv_p_9) - iVar4;
          local_234 = local_690;
          if (-1 < (int)local_690) {
            if (0x3f < (int)local_690) {
              local_690 = 0x3f;
            }
            local_234 = (uint)""[(int)local_690];
          }
          local_238 = local_694;
          if (-1 < (int)local_694) {
            if (0x3f < (int)local_694) {
              local_694 = 0x3f;
            }
            local_238 = (uint)""[(int)local_694];
          }
          if ((int)(local_234 + iVar4) < 0) {
            local_698 = 0;
          }
          else {
            local_698 = local_234 + iVar4;
          }
          local_234 = local_698;
          if ((int)(local_238 + iVar4) < 0) {
            local_69c = 0;
          }
          else {
            local_69c = local_238 + iVar4;
          }
          local_238 = local_69c;
          qp_uv_q_9 = (local_698 + local_69c + 1 >> 1) - iVar4;
          if (qp_uv_q_9 + *(int *)&map[2].map_ipm < 0x40) {
            local_6a0 = qp_uv_q_9 + *(int *)&map[2].map_ipm;
          }
          else {
            local_6a0 = 0x3f;
          }
          if (local_6a0 < 0) {
            local_6a4 = 0;
          }
          else {
            if (qp_uv_q_9 + *(int *)&map[2].map_ipm < 0x40) {
              local_6a8 = qp_uv_q_9 + *(int *)&map[2].map_ipm;
            }
            else {
              local_6a8 = 0x3f;
            }
            local_6a4 = local_6a8;
          }
          alpha_ver_v = (uint)""[local_6a4] << (bVar11 & 0x1f);
          if (qp_uv_q_9 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_6ac = qp_uv_q_9 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_6ac = 0x3f;
          }
          if (local_6ac < 0) {
            local_6b0 = 0;
          }
          else {
            if (qp_uv_q_9 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_6b4 = qp_uv_q_9 + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_6b4 = 0x3f;
            }
            local_6b0 = local_6b4;
          }
          beta_ver_v = (uint)""[local_6b0] << (bVar11 & 0x1f);
          local_37c = iVar4;
          local_374 = iVar6;
          local_214 = iVar4;
          local_210 = local_378;
          local_20c = iVar6;
          local_1dc = iVar4;
          local_1d8 = local_378;
          local_1d4 = iVar6;
        }
        if (((i_scu % pichdr[4].alf_param.filterCoeff_luma[7][7] == 0) && (i_scu != 0)) ||
           ((iVar5 % pichdr[4].alf_param.filterCoeff_luma[7][7] == 0 &&
            (iVar5 < pichdr[4].alf_param.filterCoeff_luma[7][5])))) {
          if (iVar5 % pichdr[4].alf_param.filterCoeff_luma[7][7] == 0) {
            cVar1 = pcVar10[1];
          }
          else {
            cVar1 = *pcVar10;
          }
          local_4a4 = (int)cVar1;
          local_3a0 = map;
          local_3a8 = local_4a4;
          local_3b0 = beta_hor_y;
          local_3b8 = &alpha_hor_u;
          piStack_3c0 = &beta_hor_u;
          core_local._4_4_ = iVar6 + local_4a4 + 1 + iVar4 * -2 >> 1;
          if (core_local._4_4_ + *(int *)&map[2].map_ipm < 0x40) {
            local_6b8 = core_local._4_4_ + *(int *)&map[2].map_ipm;
          }
          else {
            local_6b8 = 0x3f;
          }
          if (local_6b8 < 0) {
            local_6bc = 0;
          }
          else {
            if (core_local._4_4_ + *(int *)&map[2].map_ipm < 0x40) {
              local_6c0 = core_local._4_4_ + *(int *)&map[2].map_ipm;
            }
            else {
              local_6c0 = 0x3f;
            }
            local_6bc = local_6c0;
          }
          alpha_hor_u = (uint)""[local_6bc] << (bVar11 & 0x1f);
          if (core_local._4_4_ + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_6c4 = core_local._4_4_ + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_6c4 = 0x3f;
          }
          if (local_6c4 < 0) {
            local_6c8 = 0;
          }
          else {
            if (core_local._4_4_ + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_6cc = core_local._4_4_ + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_6cc = 0x3f;
            }
            local_6c8 = local_6cc;
          }
          beta_hor_u = (uint)""[local_6c8] << (bVar11 & 0x1f);
          qp_uv_p_10 = (int)*(char *)((long)&map[2].map_patch + 1);
          local_240 = map;
          local_248 = local_4a4;
          local_250 = beta_hor_y;
          local_258 = &alpha_hor_v;
          _qp_17 = &beta_hor_v;
          local_6d0 = (iVar6 + qp_uv_p_10) - iVar4;
          local_6d4 = (local_4a4 + qp_uv_p_10) - iVar4;
          local_26c = local_6d0;
          if (-1 < (int)local_6d0) {
            if (0x3f < (int)local_6d0) {
              local_6d0 = 0x3f;
            }
            local_26c = (uint)""[(int)local_6d0];
          }
          local_270 = local_6d4;
          if (-1 < (int)local_6d4) {
            if (0x3f < (int)local_6d4) {
              local_6d4 = 0x3f;
            }
            local_270 = (uint)""[(int)local_6d4];
          }
          if ((int)(local_26c + iVar4) < 0) {
            local_6d8 = 0;
          }
          else {
            local_6d8 = local_26c + iVar4;
          }
          local_26c = local_6d8;
          if ((int)(local_270 + iVar4) < 0) {
            local_6dc = 0;
          }
          else {
            local_6dc = local_270 + iVar4;
          }
          local_270 = local_6dc;
          qp_uv_q_10 = (local_6d8 + local_6dc + 1 >> 1) - iVar4;
          if (qp_uv_q_10 + *(int *)&map[2].map_ipm < 0x40) {
            local_6e0 = qp_uv_q_10 + *(int *)&map[2].map_ipm;
          }
          else {
            local_6e0 = 0x3f;
          }
          if (local_6e0 < 0) {
            local_6e4 = 0;
          }
          else {
            if (qp_uv_q_10 + *(int *)&map[2].map_ipm < 0x40) {
              local_6e8 = qp_uv_q_10 + *(int *)&map[2].map_ipm;
            }
            else {
              local_6e8 = 0x3f;
            }
            local_6e4 = local_6e8;
          }
          alpha_hor_v = (uint)""[local_6e4] << (bVar11 & 0x1f);
          if (qp_uv_q_10 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_6ec = qp_uv_q_10 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_6ec = 0x3f;
          }
          if (local_6ec < 0) {
            local_6f0 = 0;
          }
          else {
            if (qp_uv_q_10 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_6f4 = qp_uv_q_10 + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_6f4 = 0x3f;
            }
            local_6f0 = local_6f4;
          }
          beta_hor_v = (uint)""[local_6f0] << (bVar11 & 0x1f);
          qp_uv_p_11 = (int)*(char *)((long)&map[2].map_patch + 2);
          local_278 = map;
          local_280 = local_4a4;
          local_288 = beta_hor_y;
          local_290 = &fix_qp;
          _qp_18 = &pix_start_y;
          local_6f8 = (iVar6 + qp_uv_p_11) - iVar4;
          local_6fc = (local_4a4 + qp_uv_p_11) - iVar4;
          local_2a4 = local_6f8;
          if (-1 < (int)local_6f8) {
            if (0x3f < (int)local_6f8) {
              local_6f8 = 0x3f;
            }
            local_2a4 = (uint)""[(int)local_6f8];
          }
          local_2a8 = local_6fc;
          if (-1 < (int)local_6fc) {
            if (0x3f < (int)local_6fc) {
              local_6fc = 0x3f;
            }
            local_2a8 = (uint)""[(int)local_6fc];
          }
          if ((int)(local_2a4 + iVar4) < 0) {
            local_700 = 0;
          }
          else {
            local_700 = local_2a4 + iVar4;
          }
          local_2a4 = local_700;
          if ((int)(local_2a8 + iVar4) < 0) {
            local_704 = 0;
          }
          else {
            local_704 = local_2a8 + iVar4;
          }
          local_2a8 = local_704;
          qp_uv_q_11 = (local_700 + local_704 + 1 >> 1) - iVar4;
          if (qp_uv_q_11 + *(int *)&map[2].map_ipm < 0x40) {
            local_708 = qp_uv_q_11 + *(int *)&map[2].map_ipm;
          }
          else {
            local_708 = 0x3f;
          }
          if (local_708 < 0) {
            local_70c = 0;
          }
          else {
            if (qp_uv_q_11 + *(int *)&map[2].map_ipm < 0x40) {
              local_710 = qp_uv_q_11 + *(int *)&map[2].map_ipm;
            }
            else {
              local_710 = 0x3f;
            }
            local_70c = local_710;
          }
          fix_qp = (uint)""[local_70c] << (bVar11 & 0x1f);
          if (qp_uv_q_11 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
            local_714 = qp_uv_q_11 + *(int *)((long)&map[2].map_ipm + 4);
          }
          else {
            local_714 = 0x3f;
          }
          if (local_714 < 0) {
            local_718 = 0;
          }
          else {
            if (qp_uv_q_11 + *(int *)((long)&map[2].map_ipm + 4) < 0x40) {
              local_71c = qp_uv_q_11 + *(int *)((long)&map[2].map_ipm + 4);
            }
            else {
              local_71c = 0x3f;
            }
            local_718 = local_71c;
          }
          pix_start_y = (uint)""[local_718] << (bVar11 & 0x1f);
          local_3ac = iVar4;
          local_3a4 = iVar6;
          local_284 = iVar4;
          local_27c = iVar6;
          local_24c = iVar4;
          local_244 = iVar6;
        }
      }
      uVar2 = CONCAT11(map_cur[s_c + 2],map_cur[2]);
      uVar7 = (uint)uVar2 & 0x303;
      if ((((uVar2 & 0x303) != 0) &&
          ((*uavs3d_funs_handle.deblock_luma[0])(src_uv + iVar5,shift,alpha_hor_u,beta_hor_u,uVar7),
          iVar5 % 0x10 == 0)) && ((uVar2 & 0x202) != 0)) {
        (*uavs3d_funs_handle.deblock_chroma[0])
                  (_qp + iVar5,alpha_hor_y,alpha_hor_v,beta_hor_v,fix_qp,pix_start_y,uVar7);
      }
      uVar2 = *(ushort *)map_cur;
      uVar7 = (int)(uint)uVar2 >> 2 & 0x303;
      if (((uVar7 != 0) &&
          ((*uavs3d_funs_handle.deblock_luma[1])(src_uv + i_scu,shift,alpha_ver_y,beta_ver_y,uVar7),
          i_lcu % 0x10 == 0)) && (((int)(uint)uVar2 >> 2 & 0x202U) != 0)) {
        (*uavs3d_funs_handle.deblock_chroma[1])
                  (_qp + i_scu,alpha_hor_y,alpha_ver_u,beta_ver_u,alpha_ver_v,beta_ver_v,uVar7);
      }
      map_cur = map_cur + 2;
    }
    src_uv = src_uv + (shift << 3);
    _qp = _qp + (alpha_hor_y << 2);
  }
  return;
}

Assistant:

void com_deblock_lcu_row(com_core_t *core, int lcu_y)
{
    com_seqh_t *seqhdr =  core->seqhdr;
    com_pic_header_t *pichdr =  core->pichdr;
    com_map_t *map   = &core->map;
    com_pic_t * pic  =  core->pic;
    int pix_y, pix_x;
    int i_lcu = seqhdr->pic_width_in_lcu;
    int i_scu = seqhdr->i_scu;
    int s_l = pic->stride_luma;
    int s_c = pic->stride_chroma;
    int shift = seqhdr->bit_depth_internal - 8;
    int alpha_hor_y, beta_hor_y, alpha_ver_y, beta_ver_y;
    int alpha_hor_u, beta_hor_u, alpha_ver_u, beta_ver_u;
    int alpha_hor_v, beta_hor_v, alpha_ver_v, beta_ver_v;
    int fix_qp = pichdr->fixed_picture_qp_flag;
    int pix_start_y = lcu_y * seqhdr->max_cuwh;
    int pix_end_y = COM_MIN(pix_start_y + seqhdr->max_cuwh, seqhdr->pic_height);
    pel *src_l = pic->y + pix_start_y * s_l;
    pel *src_uv = pic->uv + (pix_start_y >> 1) * s_c;
    int qp_offset = seqhdr->bit_depth_2_qp_offset;

    if (fix_qp) {
        int qp = map->map_qp[lcu_y * i_lcu];
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
    }

    for (pix_y = pix_start_y; pix_y < pix_end_y; pix_y += LOOPFILTER_GRID) {
        u8 *edge_flag = map->map_edge + (pix_y >> MIN_CU_LOG2) * i_scu;
        s8 *map_cur = map->map_qp + (pix_y >> seqhdr->log2_max_cuwh) * i_lcu;
        s8 *map_top = map->map_qp + ((pix_y - LOOPFILTER_GRID) >> seqhdr->log2_max_cuwh) * i_lcu;

        if (!fix_qp) {
            int qp_p = map_cur[0];
            if (pix_y) {
                int qp_q = map_top[0];
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
            }
            {
                int qp_q = qp_p;
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
            }
        }
        for (pix_x = 0; pix_x < seqhdr->pic_width; pix_x += LOOPFILTER_GRID) {
            int pix_x_ver = pix_x + LOOPFILTER_GRID;

            if (!fix_qp) {
                s8 *map_qp = map_cur + (pix_x >> seqhdr->log2_max_cuwh);
                int qp_p = map_qp[0];

                if (pix_x % seqhdr->max_cuwh == 0 && pix_x && pix_y) {
                    int qp_q = map_top[pix_x >> seqhdr->log2_max_cuwh];
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
                } 
                if ((pix_x % seqhdr->max_cuwh == 0 && pix_x) || (pix_x_ver % seqhdr->max_cuwh == 0 && pix_x_ver < seqhdr->pic_width)) {
                    int qp_q;
                    if (pix_x_ver % seqhdr->max_cuwh == 0) {
                        qp_q = map_qp[1];
                    } else {
                        qp_q = map_qp[0];
                    }
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
                }
            }

            int edge = ((edge_flag[2]) | ((edge_flag[2 + i_scu]) << 8)) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[0](src_l + pix_x_ver, s_l, alpha_ver_y, beta_ver_y, edge);

                if (pix_x_ver % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[0](src_uv + pix_x_ver, s_c, alpha_ver_u, beta_ver_u, alpha_ver_v, beta_ver_v, edge);
                }
            }
            
            edge = (M16(edge_flag) >> 2) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[1](src_l + pix_x, s_l, alpha_hor_y, beta_hor_y, edge);

                if (pix_y % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[1](src_uv + pix_x, s_c, alpha_hor_u, beta_hor_u, alpha_hor_v, beta_hor_v, edge);
                }
            }
            
            edge_flag += 2;
        }

        src_l  += s_l *  LOOPFILTER_GRID;
        src_uv += s_c * (LOOPFILTER_GRID / 2);
    }
}